

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

int SUNLinSolSpace_SPFGMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  sunindextype local_38;
  sunindextype lrw1;
  sunindextype liw1;
  long *plStack_20;
  int maxl;
  long *leniwLS_local;
  long *lenrwLS_local;
  SUNLinearSolver S_local;
  
  liw1._4_4_ = *S->content;
  plStack_20 = leniwLS;
  leniwLS_local = lenrwLS;
  if (*(long *)(*(long *)(*(long *)((long)S->content + 0x90) + 8) + 0x20) == 0) {
    lrw1 = 0;
    local_38 = 0;
  }
  else {
    lenrwLS_local = (long *)S;
    N_VSpace(*(N_Vector *)((long)S->content + 0x90),&local_38,&lrw1);
  }
  *leniwLS_local = local_38 * (liw1._4_4_ * 2 + 4) + (long)(liw1._4_4_ * (liw1._4_4_ + 5)) + 2;
  *plStack_20 = lrw1 * (liw1._4_4_ * 2 + 4);
  return 0;
}

Assistant:

int SUNLinSolSpace_SPFGMR(SUNLinearSolver S, 
                          long int *lenrwLS, 
                          long int *leniwLS)
{
  int maxl;
  sunindextype liw1, lrw1;
  maxl = SPFGMR_CONTENT(S)->maxl;
  if (SPFGMR_CONTENT(S)->vtemp->ops->nvspace)
    N_VSpace(SPFGMR_CONTENT(S)->vtemp, &lrw1, &liw1);
  else
    lrw1 = liw1 = 0;
  *lenrwLS = lrw1*(2*maxl + 4) + maxl*(maxl + 5) + 2;
  *leniwLS = liw1*(2*maxl + 4);
  return(SUNLS_SUCCESS);
}